

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O3

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit(AnalysisScopeVisitor *this,NetSymbol *symbol)

{
  undefined8 uVar1;
  DiagCode unusedCode;
  undefined8 uVar2;
  Result visitor;
  AnalysisContext *local_28;
  NetSymbol *local_20;
  
  uVar2 = 0x10022000e;
  local_28 = this->context;
  local_20 = symbol;
  ast::NetSymbol::visitExprs<slang::analysis::NonProceduralExprVisitor&>
            (symbol,(Result *)&stack0xffffffffffffffd8);
  if (symbol->isImplicit == true) {
    unusedCode.subsystem = Analysis;
    unusedCode.code = 0x22;
    uVar1 = 0x10022000e;
  }
  else {
    uVar1 = 0x10019000e;
    uVar2 = 0x1001d000e;
    unusedCode.subsystem = Analysis;
    unusedCode.code = 0x24;
  }
  checkValueUnused(this,&symbol->super_ValueSymbol,unusedCode,
                   (_Optional_base<slang::DiagCode,_true,_true>)SUB86(uVar1,0),
                   (_Optional_base<slang::DiagCode,_true,_true>)SUB86(uVar2,0));
  return;
}

Assistant:

void visit(const NetSymbol& symbol) {
        visitExprs(symbol);

        if (symbol.isImplicit) {
            checkValueUnused(symbol, diag::UnusedImplicitNet, diag::UnusedImplicitNet,
                             diag::UnusedImplicitNet);
        }
        else {
            checkValueUnused(symbol, diag::UnusedNet, diag::UndrivenNet, diag::UnusedButSetNet);
        }
    }